

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtfHandler.cpp
# Opt level: O1

u16string * __thiscall
UtfHandler::utf8to16(u16string *__return_storage_ptr__,UtfHandler *this,string *input)

{
  char *__first;
  
  __first = (input->_M_dataplus)._M_p;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8_utf16<char16_t,_1114111UL,_(std::codecvt_mode)0>,_char16_t,_std::allocator<char16_t>,_std::allocator<char>_>
  ::from_bytes(__return_storage_ptr__,&this->converter,__first,__first + input->_M_string_length);
  return __return_storage_ptr__;
}

Assistant:

u16string UtfHandler::utf8to16 (const string &input) {
    try {
        return converter.from_bytes(input);
    } catch (...) {
        return u"FAILED :("; // TODO: Add options to recover from this (e.g., resync entire file -- pass handling routine as lambda)
    }
}